

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes,VkQueryPool queryPool)

{
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  *pvVar1;
  pointer pPVar2;
  Allocation *pAVar3;
  pointer pPVar4;
  VkResult result_00;
  DeviceInterface *vkd;
  VkDevice device;
  uint *puVar5;
  long lVar6;
  long lVar7;
  TestStatus *pTVar8;
  deUint64 dVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Allocation local_88;
  TestStatus *local_68;
  deUint64 result;
  long local_58;
  long local_50 [2];
  SharedPtr<vkt::Draw::Buffer> *local_40;
  VkDeviceSize local_38;
  
  local_68 = __return_storage_ptr__;
  local_40 = buffer;
  local_38 = bufferSizeBytes;
  vkd = Context::getDeviceInterface
                  ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                   super_TestInstance.m_context);
  device = Context::getDevice((this->super_ComputeInvocationsTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  result = 0;
  pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
  pPVar2 = (pvVar1->
           super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(pvVar1->
                super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2;
  if (lVar7 == 0) {
    dVar9 = 0;
  }
  else {
    lVar7 = (lVar7 >> 3) * 0x6db6db6db6db6db7;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    puVar5 = (pPVar2->groupSize).m_data + 2;
    dVar9 = 0;
    do {
      dVar9 = dVar9 + puVar5[-4] * puVar5[-5] * puVar5[-3] * ((UVec3 *)(puVar5 + -2))->m_data[0] *
                      puVar5[-1] * *puVar5;
      puVar5 = puVar5 + 0xe;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  result_00 = (*vkd->_vptr_DeviceInterface[0x20])(vkd,device,queryPool.m_internal,0,1,8,&result,0,1)
  ;
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x21e);
  if (dVar9 != result) {
    local_88._vptr_Allocation = (_func_int **)&local_88.m_offset;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"QueryPoolResults incorrect","");
    pTVar8 = local_68;
    local_68->m_code = QP_TEST_RESULT_FAIL;
    (local_68->m_description)._M_dataplus._M_p = (pointer)&(local_68->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68->m_description,local_88._vptr_Allocation,
               local_88.m_memory.m_internal + (long)local_88._vptr_Allocation);
    goto LAB_006ac6dd;
  }
  pAVar3 = (local_40->m_ptr->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_88._vptr_Allocation = (_func_int **)&PTR__Allocation_00d1abf8;
  local_88.m_memory.m_internal = (pAVar3->m_memory).m_internal;
  local_88.m_offset = pAVar3->m_offset;
  local_88.m_hostPtr = pAVar3->m_hostPtr;
  ::vk::invalidateMappedMemoryRange(vkd,device,local_88.m_memory,local_88.m_offset,local_38);
  pTVar8 = local_68;
  pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
  pPVar2 = (pvVar1->
           super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (pvVar1->
           super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pPVar4 - (long)pPVar2 >> 3;
  lVar6 = lVar7 * 0x6db6db6db6db6db7;
  if (pPVar4 == pPVar2) {
    uVar10 = 0xffffffff;
LAB_006ac675:
    uVar12 = lVar7 * -0x6db6db6db6db6db7;
    uVar14 = 0;
    do {
      uVar12 = uVar12 + lVar6;
      if (uVar12 != *(uint *)((long)local_88.m_hostPtr + uVar14 * 4)) {
        result = (deUint64)local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&result,"Compute shader didn\'t write data to the buffer","");
        pTVar8->m_code = QP_TEST_RESULT_FAIL;
        (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar8->m_description,result,local_58 + result);
        if ((long *)result != local_50) {
          operator_delete((void *)result,local_50[0] + 1);
        }
        ::vk::Allocation::~Allocation(&local_88);
        return pTVar8;
      }
      uVar14 = uVar14 + 1;
    } while (uVar10 != uVar14);
  }
  else {
    lVar13 = lVar6 + (ulong)(lVar6 == 0);
    puVar5 = (pPVar2->groupSize).m_data + 2;
    uVar10 = 0xffffffff;
    do {
      uVar11 = puVar5[-4] * puVar5[-5] * puVar5[-3] * ((UVec3 *)(puVar5 + -2))->m_data[0] *
               puVar5[-1] * *puVar5;
      if (uVar10 < uVar11) {
        uVar11 = uVar10;
      }
      uVar10 = uVar11;
      puVar5 = puVar5 + 0xe;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    if (uVar10 != 0) goto LAB_006ac675;
  }
  ::vk::Allocation::~Allocation(&local_88);
  local_88._vptr_Allocation = (_func_int **)&local_88.m_offset;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Pass","");
  pTVar8->m_code = QP_TEST_RESULT_PASS;
  (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar8->m_description,local_88._vptr_Allocation,
             local_88.m_memory.m_internal + (long)local_88._vptr_Allocation);
LAB_006ac6dd:
  if (local_88._vptr_Allocation != (_func_int **)&local_88.m_offset) {
    operator_delete(local_88._vptr_Allocation,local_88.m_offset + 1);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::checkResult (const de::SharedPtr<Buffer> buffer, const VkDeviceSize bufferSizeBytes, const VkQueryPool queryPool)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	{
		deUint64 result		= 0u;
		deUint64 expected	= 0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			expected += getComputeExecution(m_parameters[parametersNdx]);
		VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
		if (expected != result)
			return tcu::TestStatus::fail("QueryPoolResults incorrect");
	}

	{
		// Validate the results
		const Allocation&	bufferAllocation	= buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);
		const deUint32*		bufferPtr			= static_cast<deUint32*>(bufferAllocation.getHostPtr());
		deUint32			minSize				= ~0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			minSize = deMinu32(minSize, getComputeExecution(m_parameters[parametersNdx]));
		for (deUint32 ndx = 0u; ndx < minSize; ++ndx)
		{
			if (bufferPtr[ndx] != ndx * m_parameters.size())
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}